

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O2

void __thiscall
Js::DebugManager::UpdateConsoleScope
          (DebugManager *this,DynamicObject *copyFromScope,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int propertyId;
  BOOL BVar4;
  DynamicObject *object;
  PropertyRecord *pPVar5;
  uint32 i;
  uint uVar6;
  ScriptContext *this_00;
  undefined1 local_80 [8];
  PropertyDescriptor propertyDescriptor;
  undefined4 *local_38;
  
  if (copyFromScope == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0xa9,"(copyFromScope != nullptr)","copyFromScope != nullptr");
    if (!bVar2) {
LAB_007e2ea9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  propertyDescriptor._40_8_ = scriptContext;
  object = GetConsoleScope(this,scriptContext);
  uVar3 = (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(copyFromScope);
  uVar6 = 0;
  do {
    if (uVar3 == uVar6) {
      uVar3 = (*(object->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
      Output::Trace(ConsoleScopePhase,
                    L"Number of properties on console scope object after update are %d\n",
                    (ulong)uVar3);
      return;
    }
    propertyId = (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                           (copyFromScope,(ulong)(uVar6 & 0xffff));
    if (propertyId != -1) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_80);
      this_00 = (ScriptContext *)propertyDescriptor._40_8_;
      BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                        (&copyFromScope->super_RecyclableObject,propertyId,
                         (ScriptContext *)propertyDescriptor._40_8_,(PropertyDescriptor *)local_80);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                    ,0xb5,"(gotPropertyValue)",
                                    "DebugManager::UpdateConsoleScope Should have got valid value?")
        ;
        if (!bVar2) goto LAB_007e2ea9;
        *local_38 = 0;
        this_00 = (ScriptContext *)propertyDescriptor._40_8_;
      }
      pPVar5 = ScriptContext::GetPropertyName(this_00,propertyId);
      Output::Trace(ConsoleScopePhase,L"Adding property \'%s\'\n",pPVar5 + 1);
      BVar4 = JavascriptOperators::SetPropertyDescriptor
                        (&object->super_RecyclableObject,propertyId,(PropertyDescriptor *)local_80);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                    ,0xba,"(updateSuccess)",
                                    "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?"
                                   );
        if (!bVar2) goto LAB_007e2ea9;
        *local_38 = 0;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void DebugManager::UpdateConsoleScope(DynamicObject* copyFromScope, ScriptContext* scriptContext)
    {
        Assert(copyFromScope != nullptr);
        DynamicObject* consoleScope = this->GetConsoleScope(scriptContext);

        uint32 newPropCount = copyFromScope->GetPropertyCount();
        for (uint32 i = 0; i < newPropCount; i++)
        {
            Js::PropertyId propertyId = copyFromScope->GetPropertyId((Js::PropertyIndex)i);
            // For deleted properties we won't have a property id
            if (propertyId != Js::Constants::NoProperty)
            {
                PropertyDescriptor propertyDescriptor;
                BOOL gotPropertyValue = JavascriptOperators::GetOwnPropertyDescriptor(copyFromScope, propertyId, scriptContext, &propertyDescriptor);
                AssertMsg(gotPropertyValue, "DebugManager::UpdateConsoleScope Should have got valid value?");

                OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s'\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());

                BOOL updateSuccess = JavascriptOperators::SetPropertyDescriptor(consoleScope, propertyId, propertyDescriptor);
                AssertMsg(updateSuccess, "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?");
            }
        }

        OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Number of properties on console scope object after update are %d\n"), consoleScope->GetPropertyCount());
    }